

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall Gluco::Clause::calcAbstraction(Clause *this)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = *(ulong *)&this->header;
  if ((uVar1 & 8) == 0) {
    __assert_fail("header.has_extra",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SolverTypes.h"
                  ,0xaa,"void Gluco::Clause::calcAbstraction()");
  }
  if ((int)(uVar1 >> 0x20) < 1) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 | 1 << ((byte)(&this[1].header.field_0x0)[uVar3 * 4] >> 1 & 0x1f);
      uVar3 = uVar3 + 1;
    } while (uVar1 >> 0x20 != uVar3);
  }
  *(uint *)(&this[1].header.field_0x0 + (uVar1 >> 0x20) * 4) = uVar2;
  return;
}

Assistant:

void calcAbstraction() {
        assert(header.has_extra);
        uint32_t abstraction = 0;
        for (int i = 0; i < size(); i++)
            abstraction |= 1 << (var(data[i].lit) & 31);
        data[header.size].abs = abstraction;  }